

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall t_rb_generator::generate_enum(t_rb_generator *this,t_enum *tenum)

{
  t_rb_ofstream *out;
  undefined1 *puVar1;
  long lVar2;
  t_enum_value *ptVar3;
  pointer pcVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  int iVar6;
  pointer pptVar7;
  char *pcVar8;
  string name;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  char *local_f8;
  char local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_d8;
  int local_bc;
  char *local_b8;
  long local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  t_rb_generator *local_98;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  out = &this->f_types_;
  if (0 < *(int *)&(this->f_types_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar6 = iVar6 + 1;
    } while (iVar6 < *(int *)&(this->f_types_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"module ",7);
  iVar6 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  lVar2 = *(long *)CONCAT44(extraout_var,iVar6);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar2,((long *)CONCAT44(extraout_var,iVar6))[1] + lVar2);
  pcVar8 = local_50;
  iVar6 = toupper((int)*local_50);
  *pcVar8 = (char)iVar6;
  lVar2 = local_48;
  pcVar8 = local_50;
  if (local_50 == &local_40) {
    uStack_e0 = uStack_38;
    pcVar8 = &local_e8;
  }
  _local_e8 = CONCAT71(uStack_3f,local_40);
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,pcVar8,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (pcVar8 != &local_e8) {
    operator_delete(pcVar8);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  puVar1 = &(this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector(&local_d8,&tenum->constants_)
  ;
  if (local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar7 = local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      ptVar3 = *pptVar7;
      local_bc = ptVar3->value_;
      pcVar4 = (ptVar3->name_)._M_dataplus._M_p;
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar4,pcVar4 + (ptVar3->name_)._M_string_length);
      pcVar8 = local_70;
      iVar6 = toupper((int)*local_70);
      *pcVar8 = (char)iVar6;
      lVar2 = local_68;
      local_f8 = &local_e8;
      if (local_70 == &local_60) {
        uStack_e0 = uStack_58;
      }
      else {
        local_f8 = local_70;
      }
      _local_e8 = CONCAT71(uStack_5f,local_60);
      local_68 = 0;
      local_60 = '\0';
      local_70 = &local_60;
      generate_rdoc(this,out,&(*pptVar7)->super_t_doc);
      if (0 < *(int *)&(this->f_types_).super_ofstream.
                       super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
        iVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
          iVar6 = iVar6 + 1;
        } while (iVar6 < *(int *)&(this->f_types_).super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_f8,lVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_bc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (0 < *(int *)&(this->f_types_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar6 = iVar6 + 1;
    } while (iVar6 < *(int *)&(this->f_types_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"VALUE_MAP = {",0xd);
  if (local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar7 = local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_98 = this;
    do {
      iVar6 = (*pptVar7)->value_;
      if (pptVar7 !=
          local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
      }
      poVar5 = (ostream *)std::ostream::operator<<(out,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," => \"",5);
      pcVar4 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar4,pcVar4 + ((*pptVar7)->name_)._M_string_length);
      pcVar8 = local_b8;
      iVar6 = toupper((int)*local_b8);
      *pcVar8 = (char)iVar6;
      this = local_98;
      lVar2 = local_b0;
      pcVar8 = local_b8;
      if (local_b8 == &local_a8) {
        uStack_e0 = uStack_a0;
        pcVar8 = &local_e8;
      }
      _local_e8 = CONCAT71(uStack_a7,local_a8);
      local_b0 = 0;
      local_a8 = '\0';
      local_b8 = &local_a8;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      if (pcVar8 != &local_e8) {
        operator_delete(pcVar8);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (0 < *(int *)&(this->f_types_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar6 = iVar6 + 1;
    } while (iVar6 < *(int *)&(this->f_types_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"VALID_VALUES = Set.new([",0x18)
  ;
  if (local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar7 = local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (pptVar7 !=
          local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
      }
      pcVar4 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + ((*pptVar7)->name_)._M_string_length);
      pcVar8 = local_90;
      iVar6 = toupper((int)*local_90);
      *pcVar8 = (char)iVar6;
      lVar2 = local_88;
      pcVar8 = local_90;
      if (local_90 == &local_80) {
        uStack_e0 = uStack_78;
        pcVar8 = &local_e8;
      }
      _local_e8 = CONCAT71(uStack_7f,local_80);
      local_88 = 0;
      local_80 = '\0';
      local_90 = &local_80;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,pcVar8,lVar2);
      if (pcVar8 != &local_e8) {
        operator_delete(pcVar8);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"]).freeze",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar6 = *(int *)&(this->f_types_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)&(this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
           field_0xf8 = iVar6 + -1;
  if (1 < iVar6) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar6 = iVar6 + 1;
    } while (iVar6 < *(int *)&(this->f_types_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_rb_generator::generate_enum(t_enum* tenum) {
  f_types_.indent() << "module " << capitalize(tenum->get_name()) << endl;
  f_types_.indent_up();

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();

    // Ruby class constants have to be capitalized... omg i am so on the fence
    // about languages strictly enforcing capitalization why can't we just all
    // agree and play nice.
    string name = capitalize((*c_iter)->get_name());

    generate_rdoc(f_types_, *c_iter);
    f_types_.indent() << name << " = " << value << endl;
  }

  // Create a hash mapping values back to their names (as strings) since ruby has no native enum
  // type
  f_types_.indent() << "VALUE_MAP = {";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // Populate the hash
    int value = (*c_iter)->get_value();
    if (c_iter != constants.begin())
      f_types_ << ", ";
    f_types_ << value << " => \"" << capitalize((*c_iter)->get_name()) << "\"";
  }
  f_types_ << "}" << endl;

  // Create a set with valid values for this enum
  f_types_.indent() << "VALID_VALUES = Set.new([";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // Populate the set
    if (c_iter != constants.begin())
      f_types_ << ", ";
    f_types_ << capitalize((*c_iter)->get_name());
  }
  f_types_ << "]).freeze" << endl;

  f_types_.indent_down();
  f_types_.indent() << "end" << endl << endl;
}